

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O3

Cnf_Dat_t * Cnf_DeriveSimple(Aig_Man_t *p,int nOutputs)

{
  void **ppvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  Cnf_Dat_t *pCVar6;
  int **ppiVar7;
  int *piVar8;
  int iVar9;
  int *piVar10;
  long lVar11;
  Aig_Obj_t *pAVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  Vec_Ptr_t *pVVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  long lVar20;
  
  iVar9 = p->nObjs[6] + p->nObjs[5];
  iVar13 = p->nObjs[3] + nOutputs * 3 + 1 + iVar9 * 7;
  iVar9 = p->nObjs[3] + nOutputs + 1 + iVar9 * 3;
  pCVar6 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar6->pMan = p;
  pCVar6->nLiterals = iVar13;
  pCVar6->nClauses = iVar9;
  lVar17 = (long)iVar9;
  ppiVar7 = (int **)malloc(lVar17 * 8 + 8);
  pCVar6->pClauses = ppiVar7;
  lVar14 = (long)iVar13;
  piVar8 = (int *)malloc(lVar14 * 4);
  *ppiVar7 = piVar8;
  ppiVar7[lVar17] = piVar8 + lVar14;
  pVVar16 = p->vObjs;
  iVar9 = pVVar16->nSize;
  lVar15 = (long)iVar9;
  piVar8 = (int *)malloc(lVar15 * 4);
  pCVar6->pVarNums = piVar8;
  auVar5 = _DAT_0093d220;
  if (0 < lVar15) {
    lVar11 = lVar15 + -1;
    auVar18._8_4_ = (int)lVar11;
    auVar18._0_8_ = lVar11;
    auVar18._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar18 = auVar18 ^ _DAT_0093d220;
    auVar19 = _DAT_0093e4e0;
    auVar21 = _DAT_0093d210;
    do {
      auVar22 = auVar21 ^ auVar5;
      iVar13 = auVar18._4_4_;
      if ((bool)(~(auVar22._4_4_ == iVar13 && auVar18._0_4_ < auVar22._0_4_ ||
                  iVar13 < auVar22._4_4_) & 1)) {
        *(undefined4 *)((long)piVar8 + lVar11) = 0xffffffff;
      }
      if ((auVar22._12_4_ != auVar18._12_4_ || auVar22._8_4_ <= auVar18._8_4_) &&
          auVar22._12_4_ <= auVar18._12_4_) {
        *(undefined4 *)((long)piVar8 + lVar11 + 4) = 0xffffffff;
      }
      auVar22 = auVar19 ^ auVar5;
      iVar23 = auVar22._4_4_;
      if (iVar23 <= iVar13 && (iVar23 != iVar13 || auVar22._0_4_ <= auVar18._0_4_)) {
        *(undefined4 *)((long)piVar8 + lVar11 + 8) = 0xffffffff;
        *(undefined4 *)((long)piVar8 + lVar11 + 0xc) = 0xffffffff;
      }
      lVar20 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar20 + 4;
      lVar20 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar20 + 4;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(iVar9 + 3U >> 2) << 4 != lVar11);
  }
  iVar13 = 1;
  if ((nOutputs != 0) && (pVVar2 = p->vCos, 0 < pVVar2->nSize)) {
    ppvVar3 = pVVar2->pArray;
    lVar11 = 0;
    do {
      ppvVar1 = ppvVar3 + lVar11;
      lVar11 = lVar11 + 1;
      piVar8[*(int *)((long)*ppvVar1 + 0x24)] = (int)lVar11;
    } while (lVar11 < pVVar2->nSize);
    iVar13 = (int)lVar11 + 1;
  }
  if (0 < iVar9) {
    ppvVar3 = pVVar16->pArray;
    lVar11 = 0;
    do {
      pvVar4 = ppvVar3[lVar11];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        piVar8[*(int *)((long)pvVar4 + 0x24)] = iVar13;
        iVar13 = iVar13 + 1;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < lVar15);
  }
  pVVar2 = p->vCis;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar15 = 0;
    do {
      piVar8[*(int *)((long)ppvVar3[lVar15] + 0x24)] = iVar13 + (int)lVar15;
      lVar15 = lVar15 + 1;
    } while (lVar15 < pVVar2->nSize);
    iVar13 = iVar13 + (int)lVar15;
  }
  pAVar12 = p->pConst1;
  piVar8[pAVar12->Id] = iVar13;
  pCVar6->nVars = iVar13 + 1;
  piVar10 = *ppiVar7;
  if (0 < iVar9) {
    lVar15 = 0;
    do {
      pvVar4 = pVVar16->pArray[lVar15];
      if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
        piVar8 = pCVar6->pVarNums;
        iVar9 = piVar8[*(int *)((long)pvVar4 + 0x24)];
        iVar13 = piVar8[*(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24)];
        iVar23 = piVar8[*(int *)((*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe) + 0x24)];
        *ppiVar7 = piVar10;
        *piVar10 = iVar9 * 2;
        piVar10[1] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar13 * 2 ^ 1;
        piVar10[2] = (*(uint *)((long)pvVar4 + 0x10) & 1) + iVar23 * 2 ^ 1;
        ppiVar7[1] = piVar10 + 3;
        iVar9 = iVar9 * 2 + 1;
        piVar10[3] = iVar9;
        piVar10[4] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar13 * 2;
        ppiVar7[2] = piVar10 + 5;
        ppiVar7 = ppiVar7 + 3;
        piVar10[5] = iVar9;
        piVar10[6] = (*(uint *)((long)pvVar4 + 0x10) & 1) + iVar23 * 2;
        piVar10 = piVar10 + 7;
        pVVar16 = p->vObjs;
      }
      lVar15 = lVar15 + 1;
      iVar9 = pVVar16->nSize;
    } while (lVar15 < iVar9);
    piVar8 = pCVar6->pVarNums;
    pAVar12 = p->pConst1;
  }
  iVar13 = piVar8[pAVar12->Id];
  if (iVar13 <= iVar9) {
    *ppiVar7 = piVar10;
    ppiVar7 = ppiVar7 + 1;
    *piVar10 = iVar13 * 2;
    piVar10 = piVar10 + 1;
    pVVar16 = p->vCos;
    if (0 < pVVar16->nSize) {
      lVar15 = 0;
      piVar8 = piVar10;
      do {
        pvVar4 = pVVar16->pArray[lVar15];
        iVar9 = pCVar6->pVarNums
                [*(int *)((*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe) + 0x24)];
        if (lVar15 < (long)p->nObjs[3] - (long)nOutputs) {
          piVar10 = piVar8 + 1;
          *ppiVar7 = piVar8;
          ppiVar7 = ppiVar7 + 1;
          iVar13 = (*(uint *)((long)pvVar4 + 8) & 1) + iVar9 * 2;
        }
        else {
          iVar23 = pCVar6->pVarNums[*(int *)((long)pvVar4 + 0x24)];
          *ppiVar7 = piVar8;
          piVar8[1] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar9 * 2 ^ 1;
          ppiVar7[1] = piVar8 + 2;
          ppiVar7 = ppiVar7 + 2;
          iVar13 = iVar23 * 2;
          piVar8[2] = iVar23 * 2 + 1;
          piVar10 = piVar8 + 4;
          piVar8[3] = (*(uint *)((long)pvVar4 + 8) & 1) + iVar9 * 2;
        }
        *piVar8 = iVar13;
        lVar15 = lVar15 + 1;
        pVVar16 = p->vCos;
        piVar8 = piVar10;
      } while (lVar15 < pVVar16->nSize);
    }
    if ((long)piVar10 - (long)*pCVar6->pClauses >> 2 == lVar14) {
      if ((long)ppiVar7 - (long)pCVar6->pClauses >> 3 == lVar17) {
        return pCVar6;
      }
      __assert_fail("pClas - pCnf->pClauses == nClauses",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                    ,0x2b4,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
    }
    __assert_fail("pLits - pCnf->pClauses[0] == nLiterals",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                  ,0x2b3,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
  }
  __assert_fail("OutVar <= Aig_ManObjNumMax(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfWrite.c"
                ,0x297,"Cnf_Dat_t *Cnf_DeriveSimple(Aig_Man_t *, int)");
}

Assistant:

Cnf_Dat_t * Cnf_DeriveSimple( Aig_Man_t * p, int nOutputs )
{
    Aig_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    int OutVar, PoVar, pVars[32], * pLits, ** pClas;
    int i, nLiterals, nClauses, Number;

    // count the number of literals and clauses
    nLiterals = 1 + 7 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + 3 * nOutputs;
    nClauses = 1 + 3 * Aig_ManNodeNum(p) + Aig_ManCoNum( p ) + nOutputs;

    // allocate CNF
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = p;
    pCnf->nLiterals = nLiterals;
    pCnf->nClauses = nClauses;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;

    // create room for variable numbers
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(p) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(p) );
    for ( i = 0; i < Aig_ManObjNumMax(p); i++ )
        pCnf->pVarNums[i] = -1;
    // assign variables to the last (nOutputs) POs
    Number = 1;
    if ( nOutputs )
    {
//        assert( nOutputs == Aig_ManRegNum(p) );
//        Aig_ManForEachLiSeq( p, pObj, i )
//            pCnf->pVarNums[pObj->Id] = Number++;
        Aig_ManForEachCo( p, pObj, i )
            pCnf->pVarNums[pObj->Id] = Number++;
    }
    // assign variables to the internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    // assign variables to the PIs and constant node
    Aig_ManForEachCi( p, pObj, i )
        pCnf->pVarNums[pObj->Id] = Number++;
    pCnf->pVarNums[Aig_ManConst1(p)->Id] = Number++;
    pCnf->nVars = Number;
/*
    // print CNF numbers
    printf( "SAT numbers of each node:\n" );
    Aig_ManForEachObj( p, pObj, i )
        printf( "%d=%d ", pObj->Id, pCnf->pVarNums[pObj->Id] );
    printf( "\n" );
*/
    // assign the clauses
    pLits = pCnf->pClauses[0];
    pClas = pCnf->pClauses;
    Aig_ManForEachNode( p, pObj, i )
    {
        OutVar   = pCnf->pVarNums[ pObj->Id ];
        pVars[0] = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        pVars[1] = pCnf->pVarNums[ Aig_ObjFanin1(pObj)->Id ];

        // positive phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar; 
        *pLits++ = 2 * pVars[0] + !Aig_ObjFaninC0(pObj); 
        *pLits++ = 2 * pVars[1] + !Aig_ObjFaninC1(pObj); 
        // negative phase
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[0] + Aig_ObjFaninC0(pObj); 
        *pClas++ = pLits;
        *pLits++ = 2 * OutVar + 1; 
        *pLits++ = 2 * pVars[1] + Aig_ObjFaninC1(pObj); 
    }
 
    // write the constant literal
    OutVar = pCnf->pVarNums[ Aig_ManConst1(p)->Id ];
    assert( OutVar <= Aig_ManObjNumMax(p) );
    *pClas++ = pLits;
    *pLits++ = 2 * OutVar;  

    // write the output literals
    Aig_ManForEachCo( p, pObj, i )
    {
        OutVar = pCnf->pVarNums[ Aig_ObjFanin0(pObj)->Id ];
        if ( i < Aig_ManCoNum(p) - nOutputs )
        {
            *pClas++ = pLits;
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
        else
        {
            PoVar  = pCnf->pVarNums[ pObj->Id ];
            // first clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar; 
            *pLits++ = 2 * OutVar + !Aig_ObjFaninC0(pObj); 
            // second clause
            *pClas++ = pLits;
            *pLits++ = 2 * PoVar + 1; 
            *pLits++ = 2 * OutVar + Aig_ObjFaninC0(pObj); 
        }
    }

    // verify that the correct number of literals and clauses was written
    assert( pLits - pCnf->pClauses[0] == nLiterals );
    assert( pClas - pCnf->pClauses == nClauses );
    return pCnf;
}